

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O0

void __thiscall hgdb::json::VarStmt::serialize_(VarStmt *this,JSONWriter *w)

{
  string_view name;
  JSONWriter *this_00;
  char *pcVar1;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *this_01;
  variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_> *pvVar2;
  int __c;
  string local_48;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  JSONWriter *local_18;
  JSONWriter *w_local;
  VarStmt *this_local;
  
  local_18 = w;
  w_local = (JSONWriter *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_28,"variable");
  name._M_str = local_28._M_str;
  name._M_len = local_28._M_len;
  JSONWriter::key(w,name);
  pcVar1 = std::variant<hgdb::json::Variable,_unsigned_long>::index
                     (&this->var_,(char *)local_28._M_len,__c);
  this_00 = local_18;
  if (pcVar1 == (char *)0x0) {
    this_01 = std::get<0ul,hgdb::json::Variable,unsigned_long>(&this->var_);
    Variable::serialize(this_01,local_18);
  }
  else {
    pvVar2 = std::get<1ul,hgdb::json::Variable,unsigned_long>(&this->var_);
    std::__cxx11::to_string(&local_48,*pvVar2);
    JSONWriter::value<std::__cxx11::string>(this_00,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void serialize_(JSONWriter &w) const override {
        w.key("variable");
        if (var_.index() == 0) {
            std::get<0>(var_).serialize(w);
        } else {
            w.value(std::to_string(std::get<1>(var_)));
        }
    }